

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_matmul.c
# Opt level: O1

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  rt_variable_t **pprVar6;
  rt_variable_t *prVar7;
  rt_variable_t *prVar8;
  rt_function_error_t rVar9;
  int iVar10;
  int *piVar11;
  rt_variable_getter p_Var12;
  rt_variable_setter p_Var13;
  code *pcVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  ulong uVar18;
  rt_list_t shape;
  
  rVar9 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 2) &&
     (rVar9 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    pvVar5 = f->local_context;
    piVar11 = (int *)(*rt_malloc_func)(0x68);
    if (piVar11 == (int *)0x0) {
      rVar9 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      *(int **)f->local_context = piVar11;
      pprVar6 = f->inputs;
      prVar7 = *pprVar6;
      piVar16 = (prVar7->shape).data;
      lVar15 = (long)(prVar7->shape).size;
      iVar10 = piVar16[lVar15 + -2];
      piVar11[2] = iVar10;
      iVar17 = piVar16[lVar15 + -1];
      piVar11[1] = iVar17;
      prVar8 = pprVar6[1];
      piVar16 = (prVar8->shape).data;
      lVar15 = (long)(prVar8->shape).size;
      iVar1 = piVar16[lVar15 + -2];
      piVar11[4] = iVar1;
      iVar2 = piVar16[lVar15 + -1];
      piVar11[3] = iVar2;
      piVar16 = piVar11 + 1;
      if (*(char *)((long)pvVar5 + 8) == '\0') {
        piVar16 = piVar11 + 2;
      }
      iVar3 = *piVar16;
      piVar11[6] = iVar3;
      piVar16 = piVar11 + 3;
      if (*(char *)((long)pvVar5 + 9) != '\0') {
        piVar16 = piVar11 + 4;
      }
      iVar4 = *piVar16;
      piVar11[5] = iVar4;
      piVar11[7] = iVar17 * iVar10;
      piVar11[8] = iVar2 * iVar1;
      piVar11[9] = iVar4 * iVar3;
      *(rt_variable_t **)(piVar11 + 10) = prVar7;
      p_Var12 = select_getter(prVar7);
      *(rt_variable_getter *)(piVar11 + 0xc) = p_Var12;
      prVar7 = f->inputs[1];
      *(rt_variable_t **)(piVar11 + 0xe) = prVar7;
      p_Var12 = select_getter(prVar7);
      *(rt_variable_getter *)(piVar11 + 0x10) = p_Var12;
      *piVar11 = 1;
      pprVar6 = f->inputs;
      prVar7 = *pprVar6;
      iVar10 = (prVar7->shape).size;
      if (2 < iVar10) {
        piVar16 = (prVar7->shape).data;
        iVar17 = *piVar11;
        uVar18 = 0;
        do {
          iVar17 = iVar17 * piVar16[uVar18];
          *piVar11 = iVar17;
          uVar18 = uVar18 + 1;
        } while (iVar10 - 2 != uVar18);
      }
      prVar7 = pprVar6[1];
      iVar10 = (prVar7->shape).size;
      iVar17 = 1;
      if (2 < iVar10) {
        uVar18 = 0;
        do {
          iVar17 = iVar17 * (prVar7->shape).data[uVar18];
          uVar18 = uVar18 + 1;
        } while (iVar10 - 2 != uVar18);
      }
      prVar7 = *f->outputs;
      *(rt_variable_t **)(piVar11 + 0x12) = prVar7;
      p_Var12 = select_getter(prVar7);
      *(rt_variable_getter *)(piVar11 + 0x14) = p_Var12;
      p_Var13 = select_setter(*(rt_variable_t **)(piVar11 + 0x12));
      *(rt_variable_setter *)(piVar11 + 0x16) = p_Var13;
      shape._4_4_ = 0;
      shape.size = ((*f->outputs)->shape).size;
      shape.data = ((*f->outputs)->shape).data;
      iVar10 = calc_shape_size(shape);
      piVar11[0x18] = iVar10;
      rVar9 = RT_FUNCTION_ERROR_INVALID_SHAPE;
      if (*piVar11 == iVar17) {
        if ((((*(byte *)(*(long *)(piVar11 + 10) + 0x10) & 0xf) == 0) &&
            ((*(byte *)(*(long *)(piVar11 + 0xe) + 0x10) & 0xf) == 0)) &&
           ((*(byte *)(*(long *)(piVar11 + 0x12) + 0x10) & 0xf) == 0)) {
          pcVar14 = exec_batch_matmul;
        }
        else {
          pcVar14 = exec_batch_matmul_generic;
        }
        f->exec_func = pcVar14;
        rVar9 = RT_FUNCTION_ERROR_NOERROR;
      }
    }
  }
  return rVar9;
}

Assistant:

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  batch_matmul_local_context_t *context =
      (batch_matmul_local_context_t *)(f->local_context);
  batch_matmul_private_t *p = rt_malloc_func(sizeof(batch_matmul_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  ((batch_matmul_local_context_t *)(f->local_context))->data = (void *)p;
  p->row_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 2];
  p->col_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 1];
  p->row_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 2];
  p->col_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 1];
  p->row_y = context->transpose_a ? p->col_a : p->row_a;
  p->col_y = context->transpose_b ? p->row_b : p->col_b;
  p->offset_a = p->row_a * p->col_a;
  p->offset_b = p->row_b * p->col_b;
  p->offset_y = p->row_y * p->col_y;

  p->input_a = f->inputs[0];
  p->get_input_a = select_getter(p->input_a);
  p->input_b = f->inputs[1];
  p->get_input_b = select_getter(p->input_b);

  p->samples = 1;
  for (int i = 0; i < f->inputs[0]->shape.size - 2; ++i) {
    p->samples *= f->inputs[0]->shape.data[i];
  }

  int samples_b = 1;
  for (int j = 0; j < f->inputs[1]->shape.size - 2; ++j) {
    samples_b *= f->inputs[1]->shape.data[j];
  }

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(f->outputs[0]->shape);

  if (p->samples != samples_b) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (p->input_a->type == NN_DATA_TYPE_FLOAT &&
      p->input_b->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_BATCHMATMUL_FLOAT32
    f->exec_func = exec_batch_matmul;
#endif /* CONFIG_BATCHMATMUL_FLOAT32 */
  } else {
#ifdef CONFIG_BATCHMATMUL_GENERIC
    f->exec_func = exec_batch_matmul_generic;
#endif /* CONFIG_BATCHMATMUL_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}